

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_0::makeChain2(anon_unknown_0 *this,uint i,Promise<void> *promise)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  Promise<void> *extraout_RDX;
  Promise<void> PVar2;
  Own<kj::_::PromiseNode> OStack_78;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  Own<kj::_::PromiseNode> local_30;
  
  if (i == 0) {
    pPVar1 = (promise->super_PromiseBase).node.ptr;
    *(Disposer **)this = (promise->super_PromiseBase).node.disposer;
    *(PromiseNode **)(this + 8) = pPVar1;
    (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  }
  else {
    local_50.disposer = (promise->super_PromiseBase).node.disposer;
    local_50.ptr = (promise->super_PromiseBase).node.ptr;
    (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    _::yield();
    this_00 = (TransformPromiseNodeBase *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&OStack_78,
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:265:41),_kj::Promise<void>_>
               ::operator()<>);
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041aaa8;
    *(uint *)&this_00[1].super_PromiseNode._vptr_PromiseNode = i;
    this_00[1].dependency.disposer = local_50.disposer;
    this_00[1].dependency.ptr = local_50.ptr;
    local_50.ptr = (PromiseNode *)0x0;
    intermediate.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::CaptureByMove<kj::(anonymous_namespace)::makeChain2(unsigned_int,kj::Promise<void>)::$_0,kj::Promise<void>>,kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)this_00;
    _::maybeChain<void>(&local_40,(Promise<void> *)&intermediate);
    pPVar1 = local_40.ptr;
    local_30.disposer = local_40.disposer;
    local_40.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_40);
    *(Disposer **)this = local_40.disposer;
    *(PromiseNode **)(this + 8) = pPVar1;
    local_30.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_30);
    Own<kj::_::PromiseNode>::dispose(&intermediate);
    Own<kj::_::PromiseNode>::dispose(&OStack_78);
    Own<kj::_::PromiseNode>::dispose(&local_50);
    promise = extraout_RDX;
  }
  PVar2.super_PromiseBase.node.ptr = (PromiseNode *)promise;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<void> makeChain2(uint i, Promise<void> promise) {
  if (i > 0) {
    return evalLater(mvCapture(promise, [i](Promise<void>&& promise) -> Promise<void> {
      return makeChain2(i - 1, kj::mv(promise));
    }));
  } else {
    return kj::mv(promise);
  }
}